

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspFacade::SolveData::BoundArray::~BoundArray(BoundArray *this)

{
  size_type sVar1;
  
  sVar1 = (this->refs).ebo_.size;
  while (sVar1 != 0) {
    operator_delete((this->refs).ebo_.buf[sVar1 - 1]);
    sVar1 = (this->refs).ebo_.size - 1;
    (this->refs).ebo_.size = sVar1;
  }
  bk_lib::
  pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
  ::ebo::~ebo(&(this->refs).ebo_);
  return;
}

Assistant:

~BoundArray() { while (!refs.empty()) { delete refs.back(); refs.pop_back(); } }